

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracer.cpp
# Opt level: O0

void __thiscall
PathTracer::clear_target_images(PathTracer *this,shared_ptr<myvk::CommandPool> *command_pool)

{
  initializer_list<VkImageMemoryBarrier> __l;
  initializer_list<VkImageMemoryBarrier> __l_00;
  element_type *peVar1;
  element_type *this_00;
  element_type *peVar2;
  element_type *buffer_memory_barriers;
  ImageBase *this_01;
  shared_ptr<myvk::Fence> fence;
  shared_ptr<myvk::CommandBuffer> command_buffer;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffc0c;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffc14;
  undefined4 in_stack_fffffffffffffc1c;
  Fence *in_stack_fffffffffffffc20;
  undefined8 in_stack_fffffffffffffc28;
  VkCommandBufferUsageFlags usage;
  CommandBuffer *in_stack_fffffffffffffc30;
  undefined1 *puVar5;
  allocator_type *in_stack_fffffffffffffc38;
  allocator_type *__a;
  ImageBase *in_stack_fffffffffffffc40;
  undefined8 in_stack_fffffffffffffc48;
  undefined8 uVar6;
  VkImageLayout in_stack_fffffffffffffc50;
  VkImageLayout VVar7;
  undefined4 in_stack_fffffffffffffc54;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *in_stack_fffffffffffffc58;
  vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *in_stack_fffffffffffffc60;
  vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *memory_barriers;
  undefined8 in_stack_fffffffffffffc68;
  CommandBuffer *in_stack_fffffffffffffc70;
  CommandBuffer *this_02;
  undefined8 in_stack_fffffffffffffc80;
  VkFenceCreateFlags flags;
  Ptr<Device> *in_stack_fffffffffffffc88;
  VkClearColorValue *color;
  undefined8 in_stack_fffffffffffffc90;
  Ptr<CommandPool> *in_stack_fffffffffffffc98;
  Ptr<Fence> *fence_00;
  allocator<VkImageMemoryBarrier> local_329;
  undefined1 local_328 [72];
  allocator_type local_2e0 [72];
  undefined1 local_298 [72];
  undefined1 *local_250;
  undefined8 local_248;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> local_1d8;
  undefined8 uStack_1c0;
  CommandBuffer local_1b8;
  VkClearColorValue local_179 [4];
  Ptr<Fence> local_130 [4];
  undefined1 local_e8 [72];
  long local_a0;
  undefined8 local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  
  usage = (VkCommandBufferUsageFlags)((ulong)in_stack_fffffffffffffc28 >> 0x20);
  flags = (VkFenceCreateFlags)((ulong)in_stack_fffffffffffffc80 >> 0x20);
  myvk::CommandBuffer::Create
            (in_stack_fffffffffffffc98,
             (VkCommandBufferLevel)((ulong)in_stack_fffffffffffffc90 >> 0x20));
  peVar1 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x16f63b);
  (*(peVar1->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  myvk::Fence::Create(in_stack_fffffffffffffc88,flags);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16f677);
  myvk::CommandBuffer::Begin(in_stack_fffffffffffffc30,usage);
  this_00 = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x16f693);
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)0x16f6c7);
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)0x16f6f0);
  std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x16f704)
  ;
  myvk::ImageBase::GetMemoryBarrier
            (in_stack_fffffffffffffc40,
             (VkImageAspectFlags)((ulong)in_stack_fffffffffffffc38 >> 0x20),
             (VkAccessFlags)in_stack_fffffffffffffc38,
             (VkAccessFlags)((ulong)in_stack_fffffffffffffc30 >> 0x20),
             (VkImageLayout)in_stack_fffffffffffffc30,in_stack_fffffffffffffc50,
             (uint32_t)in_stack_fffffffffffffc58,(uint32_t)in_stack_fffffffffffffc60);
  fence_00 = local_130;
  std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x16f762)
  ;
  myvk::ImageBase::GetMemoryBarrier
            (in_stack_fffffffffffffc40,
             (VkImageAspectFlags)((ulong)in_stack_fffffffffffffc38 >> 0x20),
             (VkAccessFlags)in_stack_fffffffffffffc38,
             (VkAccessFlags)((ulong)in_stack_fffffffffffffc30 >> 0x20),
             (VkImageLayout)in_stack_fffffffffffffc30,in_stack_fffffffffffffc50,
             (uint32_t)in_stack_fffffffffffffc58,(uint32_t)in_stack_fffffffffffffc60);
  VVar7 = (VkImageLayout)((ulong)local_e8 >> 0x20);
  std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x16f7c0)
  ;
  uVar4 = 0xffffffff;
  uVar3 = 7;
  myvk::ImageBase::GetMemoryBarrier
            (in_stack_fffffffffffffc40,
             (VkImageAspectFlags)((ulong)in_stack_fffffffffffffc38 >> 0x20),
             (VkAccessFlags)in_stack_fffffffffffffc38,
             (VkAccessFlags)((ulong)in_stack_fffffffffffffc30 >> 0x20),
             (VkImageLayout)in_stack_fffffffffffffc30,in_stack_fffffffffffffc50,
             (uint32_t)in_stack_fffffffffffffc58,(uint32_t)in_stack_fffffffffffffc60);
  local_a0 = (long)local_179 + 1;
  local_98 = 3;
  color = local_179;
  std::allocator<VkImageMemoryBarrier>::allocator((allocator<VkImageMemoryBarrier> *)0x16f82b);
  __l._M_len._0_4_ = in_stack_fffffffffffffc50;
  __l._M_array = (iterator)in_stack_fffffffffffffc48;
  __l._M_len._4_4_ = in_stack_fffffffffffffc54;
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
             in_stack_fffffffffffffc40,__l,in_stack_fffffffffffffc38);
  myvk::CommandBuffer::CmdPipelineBarrier
            (in_stack_fffffffffffffc70,
             (VkPipelineStageFlags)((ulong)in_stack_fffffffffffffc68 >> 0x20),
             (VkPipelineStageFlags)in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
             in_stack_fffffffffffffc58,
             (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
             in_stack_fffffffffffffc20);
  std::allocator<VkImageMemoryBarrier>::~allocator((allocator<VkImageMemoryBarrier> *)local_179);
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
             in_stack_fffffffffffffc20);
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)in_stack_fffffffffffffc20)
  ;
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16f8c4);
  std::shared_ptr<myvk::ImageBase>::shared_ptr<myvk::Image,void>
            ((shared_ptr<myvk::ImageBase> *)CONCAT44(in_stack_fffffffffffffc14,uVar4),
             (shared_ptr<myvk::Image> *)CONCAT44(in_stack_fffffffffffffc0c,uVar3));
  local_1b8.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
  .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1b8.m_command_pool_ptr.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  myvk::CommandBuffer::CmdClearColorImage(this_00,(Ptr<ImageBase> *)fence_00,VVar7,color);
  std::shared_ptr<myvk::ImageBase>::~shared_ptr((shared_ptr<myvk::ImageBase> *)0x16f920);
  peVar2 = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x16f92d);
  this_02 = &local_1b8;
  std::shared_ptr<myvk::ImageBase>::shared_ptr<myvk::Image,void>
            ((shared_ptr<myvk::ImageBase> *)CONCAT44(in_stack_fffffffffffffc14,uVar4),
             (shared_ptr<myvk::Image> *)CONCAT44(in_stack_fffffffffffffc0c,uVar3));
  local_1d8.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_1c0 = 0;
  myvk::CommandBuffer::CmdClearColorImage(this_00,(Ptr<ImageBase> *)fence_00,VVar7,color);
  std::shared_ptr<myvk::ImageBase>::~shared_ptr((shared_ptr<myvk::ImageBase> *)0x16f989);
  buffer_memory_barriers =
       std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
       operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)0x16f996);
  memory_barriers = &local_1d8;
  std::shared_ptr<myvk::ImageBase>::shared_ptr<myvk::Image,void>
            ((shared_ptr<myvk::ImageBase> *)CONCAT44(in_stack_fffffffffffffc14,uVar4),
             (shared_ptr<myvk::Image> *)CONCAT44(in_stack_fffffffffffffc0c,uVar3));
  local_1e8 = 0;
  uStack_1e0 = 0;
  myvk::CommandBuffer::CmdClearColorImage(this_00,(Ptr<ImageBase> *)fence_00,VVar7,color);
  std::shared_ptr<myvk::ImageBase>::~shared_ptr((shared_ptr<myvk::ImageBase> *)0x16f9f2);
  this_01 = (ImageBase *)
            std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x16f9ff);
  uVar6 = 0;
  VVar7 = VK_IMAGE_LAYOUT_UNDEFINED;
  uVar4 = 0;
  local_208 = 0;
  uStack_200 = 0;
  local_1f8 = 0;
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)0x16fa2d);
  uStack_220 = CONCAT44(uVar4,VVar7);
  local_218 = 0;
  local_228 = uVar6;
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)0x16fa53);
  std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x16fa67)
  ;
  myvk::ImageBase::GetMemoryBarrier
            (this_01,(VkImageAspectFlags)((ulong)in_stack_fffffffffffffc38 >> 0x20),
             (VkAccessFlags)in_stack_fffffffffffffc38,
             (VkAccessFlags)((ulong)in_stack_fffffffffffffc30 >> 0x20),
             (VkImageLayout)in_stack_fffffffffffffc30,VVar7,(uint32_t)buffer_memory_barriers,
             (uint32_t)memory_barriers);
  __a = local_2e0;
  std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x16fac4)
  ;
  myvk::ImageBase::GetMemoryBarrier
            (this_01,(VkImageAspectFlags)((ulong)__a >> 0x20),(VkAccessFlags)__a,
             (VkAccessFlags)((ulong)in_stack_fffffffffffffc30 >> 0x20),
             (VkImageLayout)in_stack_fffffffffffffc30,VVar7,(uint32_t)buffer_memory_barriers,
             (uint32_t)memory_barriers);
  puVar5 = local_298;
  std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x16fb1e)
  ;
  uVar3 = 0xffffffff;
  myvk::ImageBase::GetMemoryBarrier
            (this_01,(VkImageAspectFlags)((ulong)__a >> 0x20),(VkAccessFlags)__a,
             (VkAccessFlags)((ulong)puVar5 >> 0x20),(VkImageLayout)puVar5,VVar7,
             (uint32_t)buffer_memory_barriers,(uint32_t)memory_barriers);
  local_250 = local_328;
  local_248 = 3;
  std::allocator<VkImageMemoryBarrier>::allocator((allocator<VkImageMemoryBarrier> *)0x16fb85);
  __l_00._M_len._0_4_ = VVar7;
  __l_00._M_array = (iterator)uVar6;
  __l_00._M_len._4_4_ = uVar4;
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)this_01,__l_00,
             __a);
  myvk::CommandBuffer::CmdPipelineBarrier
            (this_02,(VkPipelineStageFlags)((ulong)peVar2 >> 0x20),(VkPipelineStageFlags)peVar2,
             memory_barriers,
             (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
             buffer_memory_barriers,
             (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
             CONCAT44(uVar4,VVar7));
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
             in_stack_fffffffffffffc20);
  std::allocator<VkImageMemoryBarrier>::~allocator(&local_329);
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
             in_stack_fffffffffffffc20);
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)in_stack_fffffffffffffc20)
  ;
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16fc18);
  myvk::CommandBuffer::End((CommandBuffer *)0x16fc20);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16fc2f);
  myvk::CommandBuffer::Submit(this_00,fence_00);
  std::__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x16fc4e)
  ;
  myvk::Fence::Wait(in_stack_fffffffffffffc20,CONCAT44(in_stack_fffffffffffffc1c,uVar3));
  std::shared_ptr<myvk::Fence>::~shared_ptr((shared_ptr<myvk::Fence> *)0x16fc6c);
  std::shared_ptr<myvk::CommandBuffer>::~shared_ptr((shared_ptr<myvk::CommandBuffer> *)0x16fc79);
  return;
}

Assistant:

void PathTracer::clear_target_images(const std::shared_ptr<myvk::CommandPool> &command_pool) {
	std::shared_ptr<myvk::CommandBuffer> command_buffer = myvk::CommandBuffer::Create(command_pool);
	std::shared_ptr<myvk::Fence> fence = myvk::Fence::Create(command_pool->GetDevicePtr());
	command_buffer->Begin(VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT);
	command_buffer->CmdPipelineBarrier(
	    VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, {}, {},
	    {m_color_image->GetMemoryBarrier(VK_IMAGE_ASPECT_COLOR_BIT, 0, VK_ACCESS_TRANSFER_WRITE_BIT,
	                                     VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL),
	     m_albedo_image->GetMemoryBarrier(VK_IMAGE_ASPECT_COLOR_BIT, 0, VK_ACCESS_TRANSFER_WRITE_BIT,
	                                      VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL),
	     m_normal_image->GetMemoryBarrier(VK_IMAGE_ASPECT_COLOR_BIT, 0, VK_ACCESS_TRANSFER_WRITE_BIT,
	                                      VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL)});

	command_buffer->CmdClearColorImage(m_color_image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL);
	command_buffer->CmdClearColorImage(m_albedo_image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL);
	command_buffer->CmdClearColorImage(m_normal_image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL);

	command_buffer->CmdPipelineBarrier(
	    VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT, {}, {},
	    {m_color_image->GetMemoryBarrier(VK_IMAGE_ASPECT_COLOR_BIT, VK_ACCESS_TRANSFER_WRITE_BIT, 0,
	                                     VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, VK_IMAGE_LAYOUT_GENERAL),
	     m_albedo_image->GetMemoryBarrier(VK_IMAGE_ASPECT_COLOR_BIT, VK_ACCESS_TRANSFER_WRITE_BIT, 0,
	                                      VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, VK_IMAGE_LAYOUT_GENERAL),
	     m_normal_image->GetMemoryBarrier(VK_IMAGE_ASPECT_COLOR_BIT, VK_ACCESS_TRANSFER_WRITE_BIT, 0,
	                                      VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, VK_IMAGE_LAYOUT_GENERAL)});
	command_buffer->End();

	command_buffer->Submit(fence);
	fence->Wait();
}